

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void * op_url_stream_vcreate(OpusFileCallbacks *_cb,char *_url,__va_list_tag *_ap)

{
  void *pvVar1;
  OpusServerInfo *pinfo;
  OpusServerInfo info;
  OpusServerInfo *local_50;
  OpusServerInfo local_48;
  
  pvVar1 = op_url_stream_vcreate_impl(_cb,_url,&local_48,&local_50,_ap);
  if (local_50 != (OpusServerInfo *)0x0) {
    local_50->bitrate_kbps = local_48.bitrate_kbps;
    local_50->is_public = local_48.is_public;
    local_50->is_ssl = local_48.is_ssl;
    *(undefined4 *)&local_50->field_0x3c = local_48._60_4_;
    local_50->server = local_48.server;
    local_50->content_type = local_48.content_type;
    local_50->genre = local_48.genre;
    local_50->url = local_48.url;
    local_50->name = local_48.name;
    local_50->description = local_48.description;
  }
  return pvVar1;
}

Assistant:

void *op_url_stream_vcreate(OpusFileCallbacks *_cb,
 const char *_url,va_list _ap){
  OpusServerInfo   info;
  OpusServerInfo *pinfo;
  void *ret;
  ret=op_url_stream_vcreate_impl(_cb,_url,&info,&pinfo,_ap);
  if(pinfo!=NULL)*pinfo=*&info;
  return ret;
}